

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef::~QuestionRef(QuestionRef *this)

{
  RpcConnectionState *pRVar1;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
  *pPVar2;
  Disposer *pDVar3;
  long lVar4;
  OwnPromiseNode node;
  uint *puVar5;
  size_t sVar6;
  Question *in_RCX;
  anon_class_24_3_529c73a4 *func;
  Exception *e;
  NullableValue<kj::Exception> _e2317;
  OwnPromiseNode local_3a0;
  QuestionRef *local_398;
  Question local_388;
  PromiseDisposer local_360;
  undefined7 uStack_35f;
  undefined1 local_358 [40];
  pointer local_330;
  size_t sStack_328;
  Entry *local_320;
  RemoveConst<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
  *pRStack_318;
  Context *local_310;
  ArrayDisposer *pAStack_308;
  size_t local_300;
  ArrayDisposer *local_2f8;
  undefined1 local_2f0 [264];
  Detail *local_1e8;
  RemoveConst<kj::Exception::Detail> *pRStack_1e0;
  Detail *local_1d8;
  ArrayDisposer *pAStack_1d0;
  Maybe<kj::Exception> local_1c8;
  
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006f9b48;
  if ((this->connectionState).ptr.ptr != (RpcConnectionState *)0x0) {
    anon_unknown_18::
    ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::find
              ((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *)
               &local_360,(int)(this->connectionState).ptr.ptr + 0x248);
    lVar4 = CONCAT71(uStack_35f,local_360);
    if (lVar4 == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)&local_360,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x8fa,FAILED,"connectionState->questions.find(id) != nullptr",
                 "\"Question ID no longer on table?\"",
                 (char (*) [32])"Question ID no longer on table?");
      kj::_::Debug::Fault::fatal((Fault *)&local_360);
    }
    if (((((this->connectionState).ptr.ptr)->connection).tag == 1) &&
       (*(char *)(lVar4 + 0x22) == '\0')) {
      local_3a0.ptr = (PromiseNode *)&this->connectionState;
      local_398 = this;
      kj::
      runCatchingExceptions<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef::~QuestionRef()::_lambda()_1_>
                (&local_1c8,(kj *)&local_3a0,func);
      local_360 = (PromiseDisposer)local_1c8.ptr.isSet;
      if ((PromiseDisposer)local_1c8.ptr.isSet == (PromiseDisposer)0x1) {
        local_358._0_8_ = local_1c8.ptr.field_1.value.ownFile.content.ptr;
        local_358._8_8_ = local_1c8.ptr.field_1.value.ownFile.content.size_;
        local_358._16_8_ = local_1c8.ptr.field_1.value.ownFile.content.disposer;
        local_1c8.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
        local_1c8.ptr.field_1.value.ownFile.content.size_ = 0;
        local_358._24_8_ = local_1c8.ptr.field_1.value.file;
        local_358._32_8_ = local_1c8.ptr.field_1._32_8_;
        local_330 = (pointer)local_1c8.ptr.field_1.value.description.content.ptr;
        sStack_328 = local_1c8.ptr.field_1.value.description.content.size_;
        local_320 = (Entry *)local_1c8.ptr.field_1.value.description.content.disposer;
        pRStack_318 = (RemoveConst<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
                       *)local_1c8.ptr.field_1.value.context.ptr.disposer;
        local_1c8.ptr.field_1.value.description.content.ptr = (char *)0x0;
        local_1c8.ptr.field_1.value.description.content.size_ = 0;
        local_310 = local_1c8.ptr.field_1.value.context.ptr.ptr;
        pAStack_308 = (ArrayDisposer *)local_1c8.ptr.field_1.value.remoteTrace.content.ptr;
        local_1c8.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
        local_300 = local_1c8.ptr.field_1.value.remoteTrace.content.size_;
        local_2f8 = local_1c8.ptr.field_1.value.remoteTrace.content.disposer;
        local_1c8.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
        local_1c8.ptr.field_1.value.remoteTrace.content.size_ = 0;
        memcpy(local_2f0,(void *)((long)&local_1c8.ptr.field_1 + 0x68),0x105);
        local_1e8 = local_1c8.ptr.field_1.value.details.builder.ptr;
        pRStack_1e0 = local_1c8.ptr.field_1.value.details.builder.pos;
        local_1d8 = local_1c8.ptr.field_1.value.details.builder.endPtr;
        pAStack_1d0 = local_1c8.ptr.field_1.value.details.builder.disposer;
        local_1c8.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
        local_1c8.ptr.field_1.value.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
        local_1c8.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
        kj::Exception::~Exception(&local_1c8.ptr.field_1.value);
      }
      if (local_360 == (PromiseDisposer)0x1) {
        pRVar1 = (this->connectionState).ptr.ptr;
        kj::_::PromiseDisposer::
        alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
                  ((PromiseDisposer *)&local_1c8,(Exception *)local_358);
        local_3a0.ptr = (PromiseNode *)CONCAT71(local_1c8.ptr._1_7_,local_1c8.ptr.isSet);
        kj::TaskSet::add(&pRVar1->tasks,(Promise<void> *)&local_3a0);
        node.ptr = local_3a0.ptr;
        if (&(local_3a0.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
          local_3a0.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
        }
      }
      if (local_360 == (PromiseDisposer)0x1) {
        kj::Exception::~Exception((Exception *)local_358);
      }
    }
    if (*(char *)(lVar4 + 0x20) == '\x01') {
      *(undefined8 *)(lVar4 + 0x18) = 0;
    }
    else {
      anon_unknown_18::
      ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::erase
                (&local_388,&((this->connectionState).ptr.ptr)->questions,this->id,in_RCX);
      sVar6 = local_388.paramExports.size_;
      puVar5 = local_388.paramExports.ptr;
      if (local_388.paramExports.ptr != (uint *)0x0) {
        local_388.paramExports.ptr = (uint *)0x0;
        local_388.paramExports.size_ = 0;
        (**(local_388.paramExports.disposer)->_vptr_ArrayDisposer)
                  (local_388.paramExports.disposer,puVar5,4,sVar6,sVar6,0);
      }
      checkIfBecameIdle((this->connectionState).ptr.ptr);
    }
  }
  pPVar2 = (this->fulfiller).ptr.ptr;
  if (pPVar2 != (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
                 *)0x0) {
    (this->fulfiller).ptr.ptr =
         (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
          *)0x0;
    pDVar3 = (this->fulfiller).ptr.disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar2->super_PromiseRejector)._vptr_PromiseRejector);
  }
  pRVar1 = (this->connectionState).ptr.ptr;
  if (pRVar1 != (RpcConnectionState *)0x0) {
    (this->connectionState).ptr.ptr = (RpcConnectionState *)0x0;
    pDVar3 = (this->connectionState).ptr.disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(pRVar1->super_ErrorHandler)._vptr_ErrorHandler[-2] +
                      (long)&(pRVar1->super_ErrorHandler)._vptr_ErrorHandler);
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~QuestionRef() noexcept {
      // Contrary to KJ style, we declare this destructor `noexcept` because if anything in here
      // throws (without being caught) we're probably in pretty bad shape and going to be crashing
      // later anyway. Better to abort now.

      KJ_IF_SOME(c, connectionState) {
        auto& connectionState = c;

        auto& question = KJ_ASSERT_NONNULL(
            connectionState->questions.find(id), "Question ID no longer on table?");

        // Send the "Finish" message (if the connection is not already broken).
        if (connectionState->connection.is<Connected>() && !question.skipFinish) {
          KJ_IF_SOME(e, kj::runCatchingExceptions([&]() {
            auto message = connectionState->connection.get<Connected>().connection
                ->newOutgoingMessage(messageSizeHint<rpc::Finish>());
            auto builder = message->getBody().getAs<rpc::Message>().initFinish();
            builder.setQuestionId(id);
            // If we're still awaiting a return, then this request is being canceled, and we're going
            // to ignore any capabilities in the return message, so set releaseResultCaps true. If we
            // already received the return, then we've already built local proxies for the caps and
            // will send Release messages when those are destroyed.
            builder.setReleaseResultCaps(question.isAwaitingReturn);

            // Let the peer know we don't have the early cancellation bug.
            builder.setRequireEarlyCancellationWorkaround(false);

            message->send();
          })) {
            connectionState->tasks.add(kj::mv(e));
          }
        }

        // Check if the question has returned and, if so, remove it from the table.
        // Remove question ID from the table.  Must do this *after* sending `Finish` to ensure that
        // the ID is not re-allocated before the `Finish` message can be sent.
        if (question.isAwaitingReturn) {
          // Still waiting for return, so just remove the QuestionRef pointer from the table.
          question.selfRef = kj::none;
        } else {
          // Call has already returned, so we can now remove it from the table.
          connectionState->questions.erase(id, question);
          connectionState->checkIfBecameIdle();
        }
      }
    }